

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pnm.c
# Opt level: O0

pnm_t * pnm_create_from_file(char *path)

{
  int iVar1;
  FILE *__stream;
  pnm_t *__ptr;
  char *pcVar2;
  long lVar3;
  uint8_t *puVar4;
  size_t sVar5;
  bool bVar6;
  size_t len_2;
  size_t len_1;
  size_t len;
  int *piStack_440;
  int acc;
  char *p;
  int params [3];
  int nparams;
  char tmp [1024];
  pnm_t *pnm;
  FILE *f;
  char *path_local;
  
  __stream = fopen(path,"rb");
  if (__stream != (FILE *)0x0) {
    __ptr = (pnm_t *)calloc(1,0x20);
    __ptr->format = -1;
    params[1] = 0;
LAB_004f9adf:
    bVar6 = false;
    if (params[1] < 3) {
      bVar6 = __ptr->format != 4 || params[1] != 2;
    }
    if (bVar6) {
      pcVar2 = fgets((char *)(params + 2),0x400,__stream);
      if (pcVar2 == (char *)0x0) goto LAB_004f9fbd;
      if ((char)params[2] != '#') {
        piStack_440 = params + 2;
        if ((__ptr->format == -1) && ((char)params[2] == 'P')) {
          __ptr->format = params[2]._1_1_ + -0x30;
          if ((__ptr->format != 5) && ((__ptr->format != 6 && (__ptr->format != 4)))) {
            __assert_fail("pnm->format == PNM_FORMAT_GRAY || pnm->format == PNM_FORMAT_RGB || pnm->format == PNM_FORMAT_BINARY"
                          ,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/christianrauch[P]apriltag2/common/pnm.c"
                          ,0x3c,"pnm_t *pnm_create_from_file(const char *)");
          }
          piStack_440 = (int *)((long)params + 10);
        }
        while( true ) {
          bVar6 = false;
          if (params[1] < 3) {
            bVar6 = (char)*piStack_440 != '\0';
          }
          if (!bVar6) break;
          for (; (char)*piStack_440 == ' '; piStack_440 = (int *)((long)piStack_440 + 1)) {
          }
          if (((char)*piStack_440 < '0') || ('9' < (char)*piStack_440)) break;
          len._4_4_ = 0;
          while( true ) {
            bVar6 = false;
            if ('/' < (char)*piStack_440) {
              bVar6 = (char)*piStack_440 < ':';
            }
            if (!bVar6) break;
            len._4_4_ = len._4_4_ * 10 + (int)(char)*piStack_440 + -0x30;
            piStack_440 = (int *)((long)piStack_440 + 1);
          }
          lVar3 = (long)params[1];
          params[1] = params[1] + 1;
          params[lVar3 + -2] = len._4_4_;
          piStack_440 = (int *)((long)piStack_440 + 1);
        }
      }
      goto LAB_004f9adf;
    }
    __ptr->width = (int)p;
    __ptr->height = p._4_4_;
    __ptr->max = params[0];
    iVar1 = __ptr->format;
    if (iVar1 == 4) {
      __ptr->max = 1;
      __ptr->buflen = __ptr->height * ((__ptr->width + 7) / 8);
      puVar4 = (uint8_t *)malloc((ulong)__ptr->buflen);
      __ptr->buf = puVar4;
      sVar5 = fread(__ptr->buf,1,(ulong)__ptr->buflen,__stream);
      if (sVar5 == __ptr->buflen) {
        fclose(__stream);
        return __ptr;
      }
    }
    else if (iVar1 == 5) {
      if (__ptr->max == 0xff) {
        __ptr->buflen = __ptr->width * __ptr->height;
      }
      else {
        if (__ptr->max != 0xffff) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/christianrauch[P]apriltag2/common/pnm.c"
                        ,0x6d,"pnm_t *pnm_create_from_file(const char *)");
        }
        __ptr->buflen = __ptr->width * 2 * __ptr->height;
      }
      puVar4 = (uint8_t *)malloc((ulong)__ptr->buflen);
      __ptr->buf = puVar4;
      sVar5 = fread(__ptr->buf,1,(ulong)__ptr->buflen,__stream);
      if (sVar5 == __ptr->buflen) {
        fclose(__stream);
        return __ptr;
      }
    }
    else if (iVar1 == 6) {
      if (__ptr->max == 0xff) {
        __ptr->buflen = __ptr->width * __ptr->height * 3;
      }
      else {
        if (__ptr->max != 0xffff) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/christianrauch[P]apriltag2/common/pnm.c"
                        ,0x7e,"pnm_t *pnm_create_from_file(const char *)");
        }
        __ptr->buflen = __ptr->width * 2 * __ptr->height * 3;
      }
      puVar4 = (uint8_t *)malloc((ulong)__ptr->buflen);
      __ptr->buf = puVar4;
      sVar5 = fread(__ptr->buf,1,(ulong)__ptr->buflen,__stream);
      if (sVar5 == __ptr->buflen) {
        fclose(__stream);
        return __ptr;
      }
    }
LAB_004f9fbd:
    fclose(__stream);
    if (__ptr != (pnm_t *)0x0) {
      free(__ptr->buf);
      free(__ptr);
    }
  }
  return (pnm_t *)0x0;
}

Assistant:

pnm_t *pnm_create_from_file(const char *path)
{
    FILE *f = fopen(path, "rb");
    if (f == NULL)
        return NULL;

    pnm_t *pnm = calloc(1, sizeof(pnm_t));
    pnm->format = -1;

    char tmp[1024];
    int nparams = 0; // will be 3 when we're all done.
    int params[3];

    while (nparams < 3 && !(pnm->format == PNM_FORMAT_BINARY && nparams == 2)) {
        if (fgets(tmp, sizeof(tmp), f) == NULL)
            goto error;

        // skip comments
        if (tmp[0]=='#')
            continue;

        char *p = tmp;

        if (pnm->format == -1 && tmp[0]=='P') {
            pnm->format = tmp[1]-'0';
            assert(pnm->format == PNM_FORMAT_GRAY || pnm->format == PNM_FORMAT_RGB || pnm->format == PNM_FORMAT_BINARY);
            p = &tmp[2];
        }

        // pull integers out of this line until there are no more.
        while (nparams < 3 && *p!=0) {
            while (*p==' ')
                p++;

            // encounter rubbish? (End of line?)
            if (*p < '0' || *p > '9')
                break;

            int acc = 0;
            while (*p >= '0' && *p <= '9') {
                acc = acc*10 + *p - '0';
                p++;
            }

            params[nparams++] = acc;
            p++;
        }
    }

    pnm->width = params[0];
    pnm->height = params[1];
    pnm->max = params[2];

    switch (pnm->format) {
        case PNM_FORMAT_BINARY: {
            // files in the wild sometimes simply don't set max
            pnm->max = 1;

            pnm->buflen = pnm->height * ((pnm->width + 7)  / 8);
            pnm->buf = malloc(pnm->buflen);
            size_t len = fread(pnm->buf, 1, pnm->buflen, f);
            if (len != pnm->buflen)
                goto error;

            fclose(f);
            return pnm;
        }

        case PNM_FORMAT_GRAY: {
            if (pnm->max == 255)
                pnm->buflen = pnm->width * pnm->height;
            else if (pnm->max == 65535)
                pnm->buflen = 2 * pnm->width * pnm->height;
            else
                assert(0);

            pnm->buf = malloc(pnm->buflen);
            size_t len = fread(pnm->buf, 1, pnm->buflen, f);
            if (len != pnm->buflen)
                goto error;

            fclose(f);
            return pnm;
        }

        case PNM_FORMAT_RGB: {
            if (pnm->max == 255)
                pnm->buflen = pnm->width * pnm->height * 3;
            else if (pnm->max == 65535)
                pnm->buflen = 2 * pnm->width * pnm->height * 3;
            else
                assert(0);

            pnm->buf = malloc(pnm->buflen);
            size_t len = fread(pnm->buf, 1, pnm->buflen, f);
            if (len != pnm->buflen)
                goto error;
            fclose(f);
            return pnm;
        }
    }

error:
    fclose(f);

    if (pnm != NULL) {
        free(pnm->buf);
        free(pnm);
    }

    return NULL;
}